

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void TestRoundTrip(char *fn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  Allocator AVar7;
  ulong uVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  long *plVar12;
  char *pcVar13;
  ColorEncodingHandle *encoding;
  long lVar14;
  Point2i p;
  undefined1 auVar15 [16];
  Float FVar16;
  undefined1 in_ZMM2 [64];
  undefined1 in_register_000012c4 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  float delta;
  AssertionResult gtest_ar__1;
  Point2i res;
  string filename;
  AssertionResult gtest_ar_;
  ImageChannelDesc rgbDesc;
  ImageAndMetadata readImage;
  Image image;
  AssertHelper local_3b8;
  AssertHelper local_3b0;
  float local_3a4;
  string local_3a0;
  Tuple2<pbrt::Point2,_int> local_380;
  long local_378;
  char *local_370;
  string local_368;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 local_318 [16];
  long *local_308 [2];
  long local_2f8 [2];
  undefined1 local_2e8 [16];
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_2d0;
  ulong local_2a0;
  string local_298;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  undefined1 *apuStack_258 [2];
  undefined1 auStack_248 [8];
  undefined1 auStack_240 [8];
  undefined1 local_238 [56];
  undefined1 auStack_200 [37];
  undefined1 auStack_1db [11];
  undefined1 local_1d0 [24];
  undefined1 auStack_1b8 [32];
  undefined1 auStack_1a8 [16];
  bool bStack_198;
  undefined7 uStack_197;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  bool local_154;
  bool local_140;
  bool local_134;
  bool local_12c;
  bool local_124;
  bool local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_110;
  ColorEncodingHandle local_d8;
  ColorEncodingHandle local_d0;
  Image local_c8;
  
  local_380.x = 0x10;
  local_380.y = 0x1d;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"R","");
  apuStack_258[0] = local_278 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_278 + 0x20),"G","");
  plVar12 = (long *)(local_238 + 0x10);
  local_238._0_8_ = plVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"B","");
  encoding = &local_d0;
  local_d0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  local_370 = fn;
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  pbrt::Image::Image(&local_c8,Float,(Point2i)0x1d00000010,channels,encoding,AVar7);
  lVar10 = -0x60;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  if (0 < local_380.y) {
    uVar8 = (ulong)local_380 & 0xffffffff;
    lVar10 = 0;
    lVar14 = 0;
    iVar6 = local_380.y;
    do {
      if (0 < (int)uVar8) {
        local_2e8._0_4_ = (undefined4)(int)lVar14;
        local_2e8._4_12_ = in_register_000012c4;
        lVar11 = 0;
        do {
          auVar4 = vpinsrd_avx(ZEXT416((uint)uVar8),local_380.y,1);
          auVar15._0_4_ = (float)(int)lVar11;
          auVar15._4_12_ = in_register_000012c4;
          auVar3 = vinsertps_avx(auVar15,ZEXT416((uint)local_2e8._0_4_),0x10);
          auVar15 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
          in_ZMM2 = ZEXT1664(auVar15);
          auVar15 = vpaddd_avx(auVar4,auVar15);
          auVar15 = vcvtdq2ps_avx(auVar15);
          auVar15 = vdivps_avx(auVar3,auVar15);
          uVar2 = vmovlps_avx(auVar15);
          local_278._8_4_ = 0xbfc00000;
          local_278._0_8_ = uVar2;
          values.n = 3;
          values.ptr = (float *)local_278;
          pbrt::Image::SetChannels(&local_c8,(Point2i)(lVar10 + lVar11),values);
          uVar8 = (ulong)local_380.x;
          lVar11 = lVar11 + 1;
        } while (lVar11 < (long)uVar8);
        iVar6 = local_380.y;
      }
      lVar14 = lVar14 + 1;
      lVar10 = lVar10 + 0x100000000;
    } while (lVar14 < iVar6);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,local_370,(allocator<char> *)local_348);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_278._0_8_,(pointer)(local_278._8_8_ + local_278._0_8_));
  if (local_278._0_8_ != (long)local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,aStack_268._M_allocated_capacity + 1);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_368._M_dataplus._M_p,
             local_368._M_dataplus._M_p + local_368._M_string_length);
  local_190 = auStack_1a8 + 8;
  _local_278 = ZEXT1664(ZEXT816(0) << 0x40);
  auStack_1b8 = (undefined1  [32])0x0;
  bStack_198 = false;
  uStack_197 = 0;
  auStack_200._8_28_ = ZEXT1628(ZEXT816(0) << 0x40);
  auStack_200[0x24] = '\0';
  auStack_1db = (undefined1  [11])0x0;
  local_1d0 = (undefined1  [24])0x0;
  local_180 = 0;
  _local_238 = _local_278;
  local_188 = local_190;
  bVar5 = pbrt::Image::Write(&local_c8,&local_298,(ImageMetadata *)local_278);
  local_348[0] = (allocator<char>)bVar5;
  local_348._8_8_ = (float *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)auStack_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_348[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)local_348,(AssertionResult *)"image.Write(filename)",
               "false","true",(char *)encoding);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
               ,0x279,(char *)local_278._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
    if (local_278._0_8_ != (long)local_278 + 0x10) {
      operator_delete((void *)local_278._0_8_,aStack_268._M_allocated_capacity + 1);
    }
    if ((((Tuple2<pbrt::Point2,_int>)local_2d0.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
       ((Tuple2<pbrt::Point2,_int>)local_2d0.alloc.memoryResource != (Tuple2<pbrt::Point2,_int>)0x0)
       ) {
      (**(code **)(*(long *)local_2d0.alloc.memoryResource + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_348 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_348 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    local_d8.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_278,&local_368,AVar7,&local_d8);
    local_2d0.alloc.memoryResource = (memory_resource *)local_278._4_8_;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)local_348,"readImage.image.Resolution()","res",(Point2<int> *)&local_2d0,
               (Point2<int> *)&local_380);
    if (local_348[0] == (allocator<char>)0x0) {
      testing::Message::Message((Message *)&local_2d0);
      if ((float *)local_348._8_8_ == (float *)0x0) {
        pcVar13 = "";
      }
      else {
        pcVar13 = *(char **)local_348._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_3a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                 ,0x27c,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a0,(Message *)&local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a0);
      if ((((Tuple2<pbrt::Point2,_int>)local_2d0.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         ((Tuple2<pbrt::Point2,_int>)local_2d0.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0)) {
        (**(code **)(*(long *)local_2d0.alloc.memoryResource + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_348 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_348 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_348._0_8_ = local_348 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"R","");
      local_328._M_allocated_capacity = (size_type)local_318;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"G","");
      plVar12 = local_2f8;
      local_308[0] = plVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"B","");
      requestedChannels.n = 3;
      requestedChannels.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348;
      pbrt::Image::GetChannelDesc
                ((ImageChannelDesc *)&local_2d0,(Image *)local_278,requestedChannels);
      lVar10 = -0x60;
      do {
        if (plVar12 != (long *)plVar12[-2]) {
          operator_delete((long *)plVar12[-2],*plVar12 + 1);
        }
        plVar12 = plVar12 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      local_3a0._M_dataplus._M_p._0_1_ = local_2d0.nStored != 0;
      local_3a0._M_string_length = 0;
      if (local_2d0.nStored == 0) {
        testing::Message::Message((Message *)&local_3b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_348,(internal *)&local_3a0,(AssertionResult *)"(bool)rgbDesc",
                   "false","true",(char *)encoding);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                   ,0x27f,(char *)local_348._0_8_);
        testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
        if ((undefined1 *)local_348._0_8_ != local_348 + 0x10) {
          operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
        }
        if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_3b8.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_3b8.data_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3a0._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (0 < local_380.y) {
          uVar8 = (ulong)local_380 & 0xffffffff;
          paVar1 = &local_3a0.field_2;
          local_378 = 0;
          iVar6 = local_380.y;
          do {
            if (0 < (int)uVar8) {
              local_2a0 = local_378 << 0x20;
              pcVar13 = (char *)0x0;
              do {
                p.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)(local_2a0 | (ulong)pcVar13);
                local_370 = pcVar13;
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_348,(Image *)local_278,p,
                           (ImageChannelDesc *)&local_2d0,(WrapMode2D)0x200000002);
                lVar10 = 0;
                do {
                  iVar6 = (int)lVar10;
                  FVar16 = pbrt::Image::GetChannel(&local_c8,p,iVar6,(WrapMode2D)0x200000002);
                  local_2e8._0_4_ = FVar16;
                  pfVar9 = (float *)local_348._8_8_;
                  if ((float *)local_348._8_8_ == (float *)0x0) {
                    pfVar9 = (float *)(local_348 + 0x10);
                  }
                  local_3a4 = FVar16 - pfVar9[lVar10];
                  local_3a0._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"pfm","");
                  bVar5 = pbrt::HasExtension(&local_368,&local_3a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3a0._M_dataplus._M_p != paVar1) {
                    operator_delete(local_3a0._M_dataplus._M_p,
                                    local_3a0.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar5) {
                    local_3b8.data_ = local_3b8.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<int,float>
                              ((internal *)&local_3a0,"0","delta",(int *)&local_3b8,&local_3a4);
                    if ((char)local_3a0._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_3b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,local_368._M_dataplus._M_p,
                                 local_368._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,":(",2);
                      std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_370);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,", ",2);
                      std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_378);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,") c = ",6);
                      std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,iVar6);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line," wrote ",7);
                      std::ostream::_M_insert<double>((double)(float)local_2e8._0_4_);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,", read ",7);
                      pfVar9 = (float *)local_348._8_8_;
                      if ((float *)local_348._8_8_ == (float *)0x0) {
                        pfVar9 = (float *)(local_348 + 0x10);
                      }
                      std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&(local_3b8.data_)->line,", delta = ",10);
                      std::ostream::_M_insert<double>((double)local_3a4);
                      pcVar13 = "";
                      if ((undefined8 *)local_3a0._M_string_length != (undefined8 *)0x0) {
                        pcVar13 = *(char **)local_3a0._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_3b0,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                                 ,0x28a,pcVar13);
                      testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8);
                      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                      if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
                          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                         (local_3b8.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_3b8.data_ + 8))();
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_3a0._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                  }
                  else {
                    local_3a0._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"exr","");
                    bVar5 = pbrt::HasExtension(&local_368,&local_3a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3a0._M_dataplus._M_p != paVar1) {
                      operator_delete(local_3a0._M_dataplus._M_p,
                                      local_3a0.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      if (lVar10 == 2) {
                        local_3b8.data_ = (AssertHelperData *)((ulong)local_3b8.data_._4_4_ << 0x20)
                        ;
                        testing::internal::CmpHelperEQ<int,float>
                                  ((internal *)&local_3a0,"0","delta",(int *)&local_3b8,&local_3a4);
                        if ((char)local_3a0._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_3b8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,"(",1);
                          std::ostream::operator<<
                                    ((ostream *)&(local_3b8.data_)->line,(int)local_370);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_3b8.data_)->line,(int)local_378);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_2e8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,", read ",7);
                          pfVar9 = (float *)(local_348._8_8_ + 8);
                          if ((float *)local_348._8_8_ == (float *)0x0) {
                            pfVar9 = (float *)(local_338 + 8);
                          }
                          std::ostream::_M_insert<double>((double)*pfVar9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,", delta = ",10);
                          std::ostream::_M_insert<double>((double)local_3a4);
                          pcVar13 = "";
                          if ((undefined8 *)local_3a0._M_string_length != (undefined8 *)0x0) {
                            pcVar13 = *(char **)local_3a0._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3b0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                                     ,0x290,pcVar13);
                          testing::internal::AssertHelper::operator=
                                    (&local_3b0,(Message *)&local_3b8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                          if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
                              (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                             (local_3b8.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_3b8.data_ + 8))();
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_3a0._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        break;
                      }
                      auVar4._8_4_ = 0x7fffffff;
                      auVar4._0_8_ = 0x7fffffff7fffffff;
                      auVar4._12_4_ = 0x7fffffff;
                      auVar15 = vandps_avx512vl(ZEXT416((uint)local_3a4),auVar4);
                      local_3b8.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
                      local_3b0.data_._0_4_ = auVar15._0_4_;
                      testing::internal::CmpHelperLT<float,double>
                                ((internal *)&local_3a0,"std::abs(delta)",".001",(float *)&local_3b0
                                 ,(double *)&local_3b8);
                      if ((char)local_3a0._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_3b8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,local_368._M_dataplus._M_p,
                                   local_368._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,":(",2);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_370)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_378)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,iVar6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_2e8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", read ",7);
                        pfVar9 = (float *)local_348._8_8_;
                        if ((float *)local_348._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_348 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", delta = ",10);
                        std::ostream::_M_insert<double>((double)local_3a4);
                        pcVar13 = "";
                        if ((undefined8 *)local_3a0._M_string_length != (undefined8 *)0x0) {
                          pcVar13 = *(char **)local_3a0._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                                   ,0x294,pcVar13);
                        testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                        if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
                            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                           (local_3b8.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_3b8.data_ + 8))();
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_3a0._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                    else {
                      if (lVar10 == 2) {
                        local_3b8.data_ = (AssertHelperData *)((ulong)local_3b8.data_._4_4_ << 0x20)
                        ;
                        pfVar9 = (float *)(local_348._8_8_ + 8);
                        if ((float *)local_348._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_338 + 8);
                        }
                        testing::internal::CmpHelperEQ<int,float>
                                  ((internal *)&local_3a0,"0","rgb[c]",(int *)&local_3b8,pfVar9);
                        if ((char)local_3a0._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_3b8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,"(",1);
                          std::ostream::operator<<
                                    ((ostream *)&(local_3b8.data_)->line,(int)local_370);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,", ",2);
                          std::ostream::operator<<
                                    ((ostream *)&(local_3b8.data_)->line,(int)local_378);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,") c = ",6);
                          std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line," wrote ",7);
                          std::ostream::_M_insert<double>((double)(float)local_2e8._0_4_);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line,", read ",7);
                          pfVar9 = (float *)(local_348._8_8_ + 8);
                          if ((float *)local_348._8_8_ == (float *)0x0) {
                            pfVar9 = (float *)(local_338 + 8);
                          }
                          std::ostream::_M_insert<double>((double)*pfVar9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&(local_3b8.data_)->line," (expected 0 back)",0x12);
                          pcVar13 = "";
                          if ((undefined8 *)local_3a0._M_string_length != (undefined8 *)0x0) {
                            pcVar13 = *(char **)local_3a0._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3b0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                                     ,0x29c,pcVar13);
                          testing::internal::AssertHelper::operator=
                                    (&local_3b0,(Message *)&local_3b8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                          if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
                              (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                             (local_3b8.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_3b8.data_ + 8))();
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_3a0._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        break;
                      }
                      auVar3._8_4_ = 0x7fffffff;
                      auVar3._0_8_ = 0x7fffffff7fffffff;
                      auVar3._12_4_ = 0x7fffffff;
                      auVar15 = vandps_avx512vl(ZEXT416((uint)local_3a4),auVar3);
                      local_3b8.data_ = (AssertHelperData *)&DAT_3f947ae147ae147b;
                      local_3b0.data_._0_4_ = auVar15._0_4_;
                      testing::internal::CmpHelperLT<float,double>
                                ((internal *)&local_3a0,"std::abs(delta)",".02",(float *)&local_3b0,
                                 (double *)&local_3b8);
                      if ((char)local_3a0._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_3b8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,local_368._M_dataplus._M_p,
                                   local_368._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,":(",2);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_370)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", ",2);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,(int)local_378)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,") c = ",6);
                        std::ostream::operator<<((ostream *)&(local_3b8.data_)->line,iVar6);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line," wrote ",7);
                        std::ostream::_M_insert<double>((double)(float)local_2e8._0_4_);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", read ",7);
                        pfVar9 = (float *)local_348._8_8_;
                        if ((float *)local_348._8_8_ == (float *)0x0) {
                          pfVar9 = (float *)(local_348 + 0x10);
                        }
                        std::ostream::_M_insert<double>((double)pfVar9[lVar10]);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&(local_3b8.data_)->line,", delta = ",10);
                        std::ostream::_M_insert<double>((double)local_3a4);
                        pcVar13 = "";
                        if ((undefined8 *)local_3a0._M_string_length != (undefined8 *)0x0) {
                          pcVar13 = *(char **)local_3a0._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3b0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                                   ,0x2a2,pcVar13);
                        testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3b8)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                        if (((local_3b8.data_ != (AssertHelperData *)0x0) &&
                            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
                           (local_3b8.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_3b8.data_ + 8))();
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_3a0._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                    }
                  }
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                ~InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                               local_348);
                uVar8 = (ulong)local_380.x;
                pcVar13 = local_370 + 1;
              } while ((long)pcVar13 < (long)uVar8);
              iVar6 = local_380.y;
            }
            local_378 = local_378 + 1;
          } while (local_378 < iVar6);
        }
        local_3a0._M_dataplus._M_p = local_3a0._M_dataplus._M_p & 0xffffffff00000000;
        iVar6 = remove(local_368._M_dataplus._M_p);
        local_3b8.data_._0_4_ = iVar6;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_348,"0","remove(filename.c_str())",(int *)&local_3a0,
                   (int *)&local_3b8);
        if (local_348[0] == (allocator<char>)0x0) {
          testing::Message::Message((Message *)&local_3a0);
          if ((float *)local_348._8_8_ == (float *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = *(char **)local_348._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_3b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image_test.cpp"
                     ,0x2ab,pcVar13);
          testing::internal::AssertHelper::operator=(&local_3b8,(Message *)&local_3a0);
          testing::internal::AssertHelper::~AssertHelper(&local_3b8);
          if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) && (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_3a0._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_348 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                (&local_2d0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_110);
    if (local_118 == true) {
      local_118 = false;
    }
    if (local_124 == true) {
      local_124 = false;
    }
    if (local_12c == true) {
      local_12c = false;
    }
    if (local_134 == true) {
      local_134 = false;
    }
    if (local_140 == true) {
      local_140 = false;
    }
    if (local_154 == true) {
      local_154 = false;
    }
    if (bStack_198 == true) {
      bStack_198 = false;
    }
    if (auStack_200[0x24] == '\x01') {
      auStack_200[0x24] = '\0';
    }
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_238 + 0x38));
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
              ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
               (local_238 + 0x18));
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
               (local_278 + 0x38));
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_278 + 0x10));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_c8.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_c8.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_c8.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.channelNames);
  return;
}

Assistant:

static void TestRoundTrip(const char *fn) {
    Point2i res(16, 29);
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            image.SetChannels({x, y}, {Float(x) / Float(res[0] - 1),
                                       Float(y) / Float(res[1] - 1), Float(-1.5)});

    std::string filename = inTestDir(fn);
    ASSERT_TRUE(image.Write(filename));

    ImageAndMetadata readImage = Image::Read(filename);
    ASSERT_EQ(readImage.image.Resolution(), res);

    ImageChannelDesc rgbDesc = readImage.image.GetChannelDesc({"R", "G", "B"});
    ASSERT_TRUE((bool)rgbDesc);

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            ImageChannelValues rgb = readImage.image.GetChannels({x, y}, rgbDesc);

            for (int c = 0; c < 3; ++c) {
                float wrote = image.GetChannel({x, y}, c);
                float delta = wrote - rgb[c];
                if (HasExtension(filename, "pfm")) {
                    // Everything should come out exact.
                    EXPECT_EQ(0, delta) << filename << ":(" << x << ", " << y
                                        << ") c = " << c << " wrote " << wrote
                                        << ", read " << rgb[c] << ", delta = " << delta;
                } else if (HasExtension(filename, "exr")) {
                    if (c == 2)
                        // -1.5 is exactly representable as a float.
                        EXPECT_EQ(0, delta)
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << ", delta = " << delta;
                    else
                        EXPECT_LT(std::abs(delta), .001)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                } else {
                    // 8 bit format...
                    if (c == 2)
                        // -1.5 should be clamped to zero.
                        EXPECT_EQ(0, rgb[c])
                            << "(" << x << ", " << y << ") c = " << c << " wrote "
                            << wrote << ", read " << rgb[c] << " (expected 0 back)";
                    else
                        // Allow a fair amount of slop, since there's an sRGB
                        // conversion before quantization to 8-bits...
                        EXPECT_LT(std::abs(delta), .02)
                            << filename << ":(" << x << ", " << y << ") c = " << c
                            << " wrote " << wrote << ", read " << rgb[c]
                            << ", delta = " << delta;
                }
            }
        }

    // Clean up
    EXPECT_EQ(0, remove(filename.c_str()));
}